

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.hpp
# Opt level: O0

number_validator<float> __thiscall
goodform::number_validator<float>::gte(number_validator<float> *this,float greater_or_equal_to)

{
  bool bVar1;
  number_validator<float> *in_RSI;
  undefined8 extraout_XMM0_Qa;
  number_validator<float> nVar2;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  error_message local_40;
  float local_1c;
  float greater_or_equal_to_local;
  number_validator<float> *this_local;
  number_validator<float> *ret;
  
  local_1c = greater_or_equal_to;
  this_local = this;
  if ((in_RSI->value_ < greater_or_equal_to) &&
     (bVar1 = error_message::empty(in_RSI->error_), bVar1)) {
    std::__cxx11::to_string(&local_80,local_1c);
    std::operator+(&local_60,"VALUE MUST BE GREATER THAN OR EQUAL TO ",&local_80);
    error_message::error_message(&local_40,&local_60);
    error_message::operator=(in_RSI->error_,&local_40);
    error_message::~error_message(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  number_validator(this,in_RSI);
  nVar2._8_8_ = extraout_XMM0_Qa;
  nVar2.error_ = (error_message *)this;
  return nVar2;
}

Assistant:

number_validator<N> number_validator<N>::gte(N greater_or_equal_to)
  {
    if (this->value_ < greater_or_equal_to && this->error_.empty())
      this->error_ = "VALUE MUST BE GREATER THAN OR EQUAL TO " + std::to_string(greater_or_equal_to);
    number_validator<N> ret(*this);
    return ret;
  }